

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O3

void Js::JavascriptExceptionOperators::AppendExternalFrameToStackTrace
               (CompoundString *bs,LPCWSTR functionName,LPCWSTR fileName,ULONG lineNumber,
               LONG characterPosition)

{
  code *pcVar1;
  bool bVar2;
  errno_t eVar3;
  CharCount CVar4;
  CharCount CVar5;
  charcount_t cVar6;
  char16 *pcVar7;
  undefined4 *puVar8;
  size_t sVar9;
  char16_t *pcVar10;
  uint uVar11;
  WCHAR local_438 [4];
  char16 ext [256];
  char16 shortfilename [256];
  
  if (DAT_015bc475 == '\x01') {
    CompoundString::AppendGeneric<6u,Js::CompoundString>((char16 (*) [6])L"\n\tat ",true,bs,true);
  }
  else {
    CompoundString::AppendGeneric<8u,Js::CompoundString>((char16 (*) [8])L"\n   at ",true,bs,true);
  }
  CompoundString::AppendCharsSz(bs,functionName);
  CompoundString::AppendGeneric<3u,Js::CompoundString>((char16 (*) [3])0x10da1e8,true,bs,true);
  if ((DAT_015bc475 == '\x01') && (*fileName != L'\0')) {
    eVar3 = _wsplitpath_s(fileName,(WCHAR *)0x0,0,(WCHAR *)0x0,0,ext + 0xfc,0x100,local_438,0x100);
    if (eVar3 == 0) {
      CompoundString::AppendCharsSz(bs,ext + 0xfc);
      fileName = local_438;
    }
  }
  CompoundString::AppendCharsSz(bs,fileName);
  CompoundString::AppendChars(bs,L':');
  pcVar7 = JavascriptString::UnsafeGetBuffer((JavascriptString *)bs);
  if (pcVar7 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                       ,0x4ed,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_00a97cdf;
    *puVar8 = 0;
  }
  bVar2 = CompoundString::OwnsLastBlock(bs);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                       ,0x4ee,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) goto LAB_00a97cdf;
    *puVar8 = 0;
  }
  bVar2 = CompoundString::HasOnlyDirectChars(bs);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                       ,0x4ef,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                       "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar2) goto LAB_00a97cdf;
    *puVar8 = 0;
  }
  CVar4 = CompoundString::LastBlockCharLength(bs);
  CVar5 = CompoundString::LastBlockCharCapacity(bs);
  if (CVar5 - CVar4 < 0xb) {
    pcVar7 = ext + 0xfc;
  }
  else {
    pcVar7 = CompoundString::LastBlockChars(bs);
    pcVar7 = pcVar7 + CVar4;
  }
  eVar3 = _ultow_s((ulong)lineNumber,(char16_t_conflict *)pcVar7,0xb,10);
  if (eVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x6b6,"(err == 0)","err == 0");
    if (!bVar2) goto LAB_00a97cdf;
    *puVar8 = 0;
  }
  sVar9 = PAL_wcslen(pcVar7);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015b6718,StringConcatPhase);
  uVar11 = (uint)sVar9;
  if (bVar2) {
    pcVar10 = L"";
    if (8 < uVar11) {
      pcVar10 = L"...";
    }
    Output::Print(L"CompoundString::AppendGeneric(TValue &, appendChars = %s) - converted = \"%.8s%s\", appendCharLength = %u\n"
                  ,L"true",pcVar7,pcVar10,sVar9 & 0xffffffff);
    Output::Flush();
  }
  if (CVar5 - CVar4 < 0xb) {
    if (pcVar7 != ext + 0xfc) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                         ,0x50c,"(convertBuffer == localConvertBuffer)",
                         "convertBuffer == localConvertBuffer");
      if (!bVar2) goto LAB_00a97cdf;
      *puVar8 = 0;
    }
    CompoundString::AppendGeneric<Js::CompoundString>(ext + 0xfc,uVar11,bs,true);
  }
  else {
    cVar6 = JavascriptString::GetLength((JavascriptString *)bs);
    JavascriptString::SetLength((JavascriptString *)bs,cVar6 + uVar11);
    CompoundString::SetLastBlockCharLength(bs,CVar4 + uVar11);
  }
  CompoundString::AppendChars(bs,L':');
  pcVar7 = JavascriptString::UnsafeGetBuffer((JavascriptString *)bs);
  if (pcVar7 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                       ,0x4ed,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_00a97cdf;
    *puVar8 = 0;
  }
  bVar2 = CompoundString::OwnsLastBlock(bs);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                       ,0x4ee,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) goto LAB_00a97cdf;
    *puVar8 = 0;
  }
  bVar2 = CompoundString::HasOnlyDirectChars(bs);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                       ,0x4ef,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                       "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar2) goto LAB_00a97cdf;
    *puVar8 = 0;
  }
  CVar4 = CompoundString::LastBlockCharLength(bs);
  CVar5 = CompoundString::LastBlockCharCapacity(bs);
  if (CVar5 - CVar4 < 0xb) {
    pcVar7 = ext + 0xfc;
  }
  else {
    pcVar7 = CompoundString::LastBlockChars(bs);
    pcVar7 = pcVar7 + CVar4;
  }
  eVar3 = _ultow_s((ulong)(uint)characterPosition,(char16_t_conflict *)pcVar7,0xb,10);
  if (eVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x6b6,"(err == 0)","err == 0");
    if (!bVar2) goto LAB_00a97cdf;
    *puVar8 = 0;
  }
  sVar9 = PAL_wcslen(pcVar7);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015b6718,StringConcatPhase);
  uVar11 = (uint)sVar9;
  if (bVar2) {
    pcVar10 = L"";
    if (8 < uVar11) {
      pcVar10 = L"...";
    }
    Output::Print(L"CompoundString::AppendGeneric(TValue &, appendChars = %s) - converted = \"%.8s%s\", appendCharLength = %u\n"
                  ,L"true",pcVar7,pcVar10,sVar9 & 0xffffffff);
    Output::Flush();
  }
  if (CVar5 - CVar4 < 0xb) {
    if (pcVar7 != ext + 0xfc) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                         ,0x50c,"(convertBuffer == localConvertBuffer)",
                         "convertBuffer == localConvertBuffer");
      if (!bVar2) {
LAB_00a97cdf:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
    CompoundString::AppendGeneric<Js::CompoundString>(ext + 0xfc,uVar11,bs,true);
  }
  else {
    cVar6 = JavascriptString::GetLength((JavascriptString *)bs);
    JavascriptString::SetLength((JavascriptString *)bs,cVar6 + uVar11);
    CompoundString::SetLastBlockCharLength(bs,CVar4 + uVar11);
  }
  CompoundString::AppendChars(bs,L')');
  return;
}

Assistant:

void JavascriptExceptionOperators::AppendExternalFrameToStackTrace(CompoundString* bs, LPCWSTR functionName, LPCWSTR fileName, ULONG lineNumber, LONG characterPosition)
    {
        // format is equivalent to wprintf("\n   at %s (%s:%d:%d)", functionName, filename, lineNumber, characterPosition);

        const CharCount maxULongStringLength = 10; // excluding null terminator
        const auto ConvertULongToString = [](const ULONG value, char16 *const buffer, const CharCount charCapacity)
        {
            const errno_t err = _ultow_s(value, buffer, charCapacity, 10);
            Assert(err == 0);
        };
        if (CONFIG_FLAG(ExtendedErrorStackForTestHost))
        {
            bs->AppendChars(_u("\n\tat "));
        }
        else
        {
            bs->AppendChars(_u("\n   at "));
        }
        bs->AppendCharsSz(functionName);
        bs->AppendChars(_u(" ("));

        if (CONFIG_FLAG(ExtendedErrorStackForTestHost) && *fileName != _u('\0'))
        {
            char16 shortfilename[_MAX_FNAME];
            char16 ext[_MAX_EXT];
            errno_t err = _wsplitpath_s(fileName, NULL, 0, NULL, 0, shortfilename, _MAX_FNAME, ext, _MAX_EXT);
            if (err != 0)
            {
                bs->AppendCharsSz(fileName);
            }
            else
            {
                bs->AppendCharsSz(shortfilename);
                bs->AppendCharsSz(ext);
            }
        }
        else
        {
            bs->AppendCharsSz(fileName);
        }
        bs->AppendChars(_u(':'));
        bs->AppendChars(lineNumber, maxULongStringLength, ConvertULongToString);
        bs->AppendChars(_u(':'));
        bs->AppendChars(characterPosition, maxULongStringLength, ConvertULongToString);
        bs->AppendChars(_u(')'));
    }